

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queryOutputWindow.cpp
# Opt level: O1

void __thiscall QueryOutputWindow::print(QueryOutputWindow *this,string *message,Type type)

{
  pointer pcVar1;
  QueryOutputMessage *this_00;
  QueryOutputMessage *local_58;
  string local_50;
  
  this_00 = (QueryOutputMessage *)operator_new(0x28);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  pcVar1 = (message->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + message->_M_string_length);
  QueryOutputMessage::QueryOutputMessage(this_00,&local_50,type);
  local_58 = this_00;
  std::vector<QueryOutputMessage*,std::allocator<QueryOutputMessage*>>::
  emplace_back<QueryOutputMessage*>
            ((vector<QueryOutputMessage*,std::allocator<QueryOutputMessage*>> *)&this->buffer,
             &local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  mvwprintw((this->super_IWindow).window,this->lineCounter,0,(message->_M_dataplus)._M_p);
  (*(this->super_IWindow)._vptr_IWindow[4])(this);
  this->lineCounter = this->lineCounter + 1;
  return;
}

Assistant:

void QueryOutputWindow::print(std::string message, QueryOutputMessage::Type type)
{
	this->buffer.push_back(new QueryOutputMessage(message, type));

	mvwprintw(this->window, this->lineCounter, 0, message.c_str());
	this->update();
	this->lineCounter++;
}